

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockCallTest.cpp
# Opt level: O0

void __thiscall
TEST_MockCallTest_shouldReturnDefaultWhenThereIsntAnythingToReturn_Test::testBody
          (TEST_MockCallTest_shouldReturnDefaultWhenThereIsntAnythingToReturn_Test *this)

{
  bool bVar1;
  UtestShell *pUVar2;
  MockSupport *pMVar3;
  TestTerminator *pTVar4;
  SimpleString local_e0;
  MockNamedValue local_d0;
  SimpleString local_70;
  MockNamedValue local_60;
  TEST_MockCallTest_shouldReturnDefaultWhenThereIsntAnythingToReturn_Test *local_10;
  TEST_MockCallTest_shouldReturnDefaultWhenThereIsntAnythingToReturn_Test *this_local;
  
  local_10 = this;
  pUVar2 = UtestShell::getCurrent();
  SimpleString::SimpleString(&local_70,"");
  pMVar3 = mock(&local_70,(MockFailureReporter *)0x0);
  (*pMVar3->_vptr_MockSupport[8])(&local_60);
  SimpleString::SimpleString(&local_e0,"");
  MockNamedValue::MockNamedValue(&local_d0,&local_e0);
  bVar1 = MockNamedValue::equals(&local_60,&local_d0);
  pTVar4 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[8])
            (pUVar2,(ulong)bVar1,"CHECK","mock().returnValue().equals(MockNamedValue(\"\"))",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockCallTest.cpp"
             ,0x1dc,pTVar4);
  MockNamedValue::~MockNamedValue(&local_d0);
  SimpleString::~SimpleString(&local_e0);
  MockNamedValue::~MockNamedValue(&local_60);
  SimpleString::~SimpleString(&local_70);
  return;
}

Assistant:

TEST(MockCallTest, shouldReturnDefaultWhenThereIsntAnythingToReturn)
{
    CHECK(mock().returnValue().equals(MockNamedValue("")));
}